

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

string * __thiscall
IRT::PrintVisitor::GetResult_abi_cxx11_(string *__return_storage_ptr__,PrintVisitor *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"digraph G{\ngraph[ordering=\"out\"];\n",&this->description);
  std::operator+(__return_storage_ptr__,&local_30,"}\n");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string IRT::PrintVisitor::GetResult( ) {
    return "digraph G{\ngraph[ordering=\"out\"];\n" + description + "}\n";
}